

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O1

bool __thiscall
bssl::ssl_is_valid_ech_config_list(bssl *this,Span<const_unsigned_char> ech_config_list)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  bool supported;
  CBS child;
  CBS cbs;
  ECHConfig ech_config;
  bool local_99;
  CBS local_98;
  CBS local_88;
  ECHConfig local_78;
  
  local_88.len = (size_t)ech_config_list.data_;
  local_88.data = (uint8_t *)this;
  iVar2 = CBS_get_u16_length_prefixed(&local_88,&local_98);
  bVar3 = false;
  if (((iVar2 != 0) && (bVar3 = false, local_98.len != 0)) &&
     ((uchar *)local_88.len == (uchar *)0x0)) {
    do {
      bVar3 = local_98.len == 0;
      if (bVar3) {
        return bVar3;
      }
      local_78.cipher_suites.data_ = (uchar *)0x0;
      local_78.cipher_suites.size_ = 0;
      local_78.public_name.data_ = (uchar *)0x0;
      local_78.public_name.size_ = 0;
      local_78.public_key.data_ = (uchar *)0x0;
      local_78.public_key.size_ = 0;
      local_78.raw.data_ = (uchar *)0x0;
      local_78.raw.size_ = 0;
      local_78.kem_id = 0;
      local_78.maximum_name_length = '\0';
      local_78.config_id = '\0';
      bVar1 = parse_ech_config(&local_98,&local_78,&local_99,false);
      OPENSSL_free(local_78.raw.data_);
    } while (bVar1);
  }
  return bVar3;
}

Assistant:

bool ssl_is_valid_ech_config_list(Span<const uint8_t> ech_config_list) {
  CBS cbs = ech_config_list, child;
  if (!CBS_get_u16_length_prefixed(&cbs, &child) ||  //
      CBS_len(&child) == 0 ||                        //
      CBS_len(&cbs) > 0) {
    return false;
  }
  while (CBS_len(&child) > 0) {
    ECHConfig ech_config;
    bool supported;
    if (!parse_ech_config(&child, &ech_config, &supported,
                          /*all_extensions_mandatory=*/false)) {
      return false;
    }
  }
  return true;
}